

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa_ctrl.c
# Opt level: O0

int EVP_PKEY_CTX_set_dsa_paramgen_md_props(EVP_PKEY_CTX *ctx,char *md_name,char *md_properties)

{
  long in_RDX;
  OSSL_PARAM *p;
  OSSL_PARAM params [3];
  int ret;
  EVP_PKEY_CTX *in_stack_fffffffffffffeb8;
  size_t in_stack_fffffffffffffec0;
  EVP_PKEY_CTX *pEVar1;
  EVP_PKEY_CTX *in_stack_fffffffffffffec8;
  EVP_PKEY_CTX *key;
  undefined1 local_128 [40];
  undefined1 local_100 [40];
  undefined1 local_d8 [40];
  EVP_PKEY_CTX *local_b0;
  char local_a8 [132];
  int local_24;
  long local_20;
  int local_4;
  
  local_b0 = (EVP_PKEY_CTX *)local_a8;
  local_20 = in_RDX;
  local_24 = dsa_paramgen_check(in_stack_fffffffffffffeb8);
  pEVar1 = local_b0;
  local_4 = local_24;
  if (0 < local_24) {
    key = local_b0;
    local_b0 = (EVP_PKEY_CTX *)((long)local_b0 + 0x28);
    OSSL_PARAM_construct_utf8_string
              ((char *)pEVar1,(char *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    memcpy(key,local_d8,0x28);
    pEVar1 = local_b0;
    if (local_20 != 0) {
      in_stack_fffffffffffffec8 = local_b0;
      local_b0 = (EVP_PKEY_CTX *)&local_b0->op;
      OSSL_PARAM_construct_utf8_string((char *)key,(char *)pEVar1,in_stack_fffffffffffffec0);
      memcpy(in_stack_fffffffffffffec8,local_100,0x28);
    }
    pEVar1 = local_b0;
    local_b0 = (EVP_PKEY_CTX *)&local_b0->op;
    OSSL_PARAM_construct_end();
    memcpy(pEVar1,local_128,0x28);
    local_4 = EVP_PKEY_CTX_set_params(in_stack_fffffffffffffec8,(OSSL_PARAM *)pEVar1);
  }
  return local_4;
}

Assistant:

int EVP_PKEY_CTX_set_dsa_paramgen_md_props(EVP_PKEY_CTX *ctx,
                                           const char *md_name,
                                           const char *md_properties)
{
    int ret;
    OSSL_PARAM params[3], *p = params;

    if ((ret = dsa_paramgen_check(ctx)) <= 0)
        return ret;

    *p++ = OSSL_PARAM_construct_utf8_string(OSSL_PKEY_PARAM_FFC_DIGEST,
                                            (char *)md_name, 0);
    if (md_properties != NULL)
        *p++ = OSSL_PARAM_construct_utf8_string(OSSL_PKEY_PARAM_FFC_DIGEST_PROPS,
                                                (char *)md_properties, 0);
    *p++ = OSSL_PARAM_construct_end();

    return EVP_PKEY_CTX_set_params(ctx, params);
}